

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  uint uVar2;
  int n;
  uint uVar3;
  char *__format;
  
  uVar3 = 1;
  printf("Array is [%d, %d, %d, %d, %d].\n",1,2,4,4,5);
  do {
    __format = "%d is in the array.\n";
    if (uVar3 != 1) {
      uVar2 = 1;
      lVar1 = 0;
      do {
        if (((int)uVar3 < (int)uVar2) || (lVar1 == 4)) {
          __format = "%d is not in the array.\n";
          goto LAB_001011b4;
        }
        uVar2 = (&DAT_00102014)[lVar1];
        lVar1 = lVar1 + 1;
      } while (uVar2 != uVar3);
      __format = "%d is in the array.\n";
    }
LAB_001011b4:
    printf(__format,(ulong)uVar3);
    uVar3 = uVar3 + 1;
    if (uVar3 == 6) {
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  const int arr[ARR_LEN] = {1, 2, 4, 4, 5};
  printf("Array is [%d, %d, %d, %d, %d].\n", arr[0], arr[1], arr[2], arr[3], arr[4]);

  for (int n = 1; n <= 5; n++) {
    if (is_in_array(arr, ARR_LEN, n)) {
      printf("%d is in the array.\n", n);
    } else {
      printf("%d is not in the array.\n", n);
    }
  }

  return 0;
}